

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckRows(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  ctmbstr pString;
  ctmbstr word;
  int numValidTH;
  int numTR;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  word._4_4_ = 0;
  word._0_4_ = 0;
  (doc->access).CheckedHeaders = (doc->access).CheckedHeaders + 1;
  for (_numValidTH = node; _numValidTH != (Node *)0x0; _numValidTH = _numValidTH->next) {
    word._4_4_ = word._4_4_ + 1;
    if (((_numValidTH->content != (Node *)0x0) && (_numValidTH->content->tag != (Dict *)0x0)) &&
       (_numValidTH->content->tag->id == TidyTag_TH)) {
      (doc->access).HasTH = yes;
      BVar1 = prvTidynodeIsText(_numValidTH->content->content);
      if (BVar1 != no) {
        pString = textFromOneNode(doc,_numValidTH->content->content);
        BVar1 = IsWhitespace(pString);
        if (BVar1 == no) {
          word._0_4_ = (int)word + 1;
        }
      }
    }
  }
  if (word._4_4_ == (int)word) {
    (doc->access).HasValidRowHeaders = yes;
  }
  if (((1 < word._4_4_) && ((int)word < word._4_4_)) &&
     ((1 < (int)word && ((doc->access).HasTH == yes)))) {
    (doc->access).HasInvalidRowHeader = yes;
  }
  return;
}

Assistant:

static void CheckRows( TidyDocImpl* doc, Node* node )
{
    int numTR = 0;
    int numValidTH = 0;
    
    doc->access.CheckedHeaders++;

    for (; node != NULL; node = node->next )
    {
        numTR++;
        if ( nodeIsTH(node->content) )
        {
            doc->access.HasTH = yes;            
            if ( TY_(nodeIsText)(node->content->content) )
            {
                ctmbstr word = textFromOneNode( doc, node->content->content);
                if ( !IsWhitespace(word) )
                    numValidTH++;
            }
        }
    }

    if (numTR == numValidTH)
        doc->access.HasValidRowHeaders = yes;

    if ( numTR >= 2 &&
         numTR > numValidTH &&
         numValidTH >= 2 &&
         doc->access.HasTH == yes )
        doc->access.HasInvalidRowHeader = yes;
}